

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2Text(xmlParserCtxtPtr ctxt,xmlChar *ch,int len,xmlElementType type)

{
  int iVar1;
  int iVar2;
  xmlChar *pxVar3;
  bool bVar4;
  int local_48;
  int local_44;
  int size;
  xmlChar *newbuf;
  int maxLength;
  int coalesceText;
  xmlNodePtr lastChild;
  xmlElementType type_local;
  int len_local;
  xmlChar *ch_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return;
  }
  if (ctxt->node != (xmlNodePtr)0x0) {
    _maxLength = ctxt->node->last;
    if (_maxLength == (xmlNodePtr)0x0) {
      if (type == XML_TEXT_NODE) {
        _maxLength = xmlSAX2TextNode(ctxt,ch,len);
      }
      else {
        _maxLength = xmlNewCDataBlock(ctxt->myDoc,ch,len);
      }
      if (_maxLength == (xmlNodePtr)0x0) {
        xmlSAX2ErrMemory(ctxt);
        return;
      }
      ctxt->node->children = _maxLength;
      ctxt->node->last = _maxLength;
      _maxLength->parent = ctxt->node;
      _maxLength->doc = ctxt->node->doc;
      ctxt->nodelen = len;
      ctxt->nodemem = len + 1;
    }
    else {
      bVar4 = false;
      if (((_maxLength != (xmlNodePtr)0x0) && (bVar4 = false, _maxLength->type == type)) &&
         ((ctxt->html == 0 || (bVar4 = true, type == XML_TEXT_NODE)))) {
        bVar4 = _maxLength->name == "text";
      }
      if ((bVar4) && (ctxt->nodemem != 0)) {
        iVar2 = 10000000;
        if ((ctxt->options & 0x80000U) != 0) {
          iVar2 = 1000000000;
        }
        if ((_xmlAttr **)_maxLength->content == &_maxLength->properties) {
          pxVar3 = xmlStrdup(_maxLength->content);
          _maxLength->content = pxVar3;
          _maxLength->properties = (_xmlAttr *)0x0;
        }
        else if ((ctxt->nodemem == ctxt->nodelen + 1) &&
                (iVar1 = xmlDictOwns(ctxt->dict,_maxLength->content), iVar1 != 0)) {
          pxVar3 = xmlStrdup(_maxLength->content);
          _maxLength->content = pxVar3;
        }
        if (_maxLength->content == (xmlChar *)0x0) {
          xmlSAX2ErrMemory(ctxt);
          return;
        }
        if ((iVar2 < len) || (iVar2 - len < ctxt->nodelen)) {
          xmlFatalErr(ctxt,XML_ERR_RESOURCE_LIMIT,"Text node too long, try XML_PARSE_HUGE");
          xmlHaltParser(ctxt);
          return;
        }
        if (ctxt->nodemem <= ctxt->nodelen + len) {
          if (0x7fffffff - len < ctxt->nodemem) {
            local_44 = 0x7fffffff;
          }
          else {
            local_44 = ctxt->nodemem + len;
          }
          if (local_44 < 0x40000000) {
            local_48 = local_44 << 1;
          }
          else {
            local_48 = 0x7fffffff;
          }
          pxVar3 = (xmlChar *)(*xmlRealloc)(_maxLength->content,(long)local_48);
          if (pxVar3 == (xmlChar *)0x0) {
            xmlSAX2ErrMemory(ctxt);
            return;
          }
          ctxt->nodemem = local_48;
          _maxLength->content = pxVar3;
        }
        memcpy(_maxLength->content + ctxt->nodelen,ch,(long)len);
        ctxt->nodelen = len + ctxt->nodelen;
        _maxLength->content[ctxt->nodelen] = '\0';
      }
      else if (bVar4) {
        iVar2 = xmlTextConcat(_maxLength,ch,len);
        if (iVar2 != 0) {
          xmlSAX2ErrMemory(ctxt);
        }
        if (ctxt->node->children != (_xmlNode *)0x0) {
          iVar2 = xmlStrlen(_maxLength->content);
          ctxt->nodelen = iVar2;
          ctxt->nodemem = ctxt->nodelen + 1;
        }
      }
      else {
        if (type == XML_TEXT_NODE) {
          _maxLength = xmlSAX2TextNode(ctxt,ch,len);
          if (_maxLength != (xmlNodePtr)0x0) {
            _maxLength->doc = ctxt->myDoc;
          }
        }
        else {
          _maxLength = xmlNewCDataBlock(ctxt->myDoc,ch,len);
        }
        if (_maxLength == (xmlNodePtr)0x0) {
          xmlSAX2ErrMemory(ctxt);
        }
        else {
          xmlSAX2AppendChild(ctxt,_maxLength);
          if (ctxt->node->children != (_xmlNode *)0x0) {
            ctxt->nodelen = len;
            ctxt->nodemem = len + 1;
          }
        }
      }
    }
    if ((((_maxLength != (xmlNodePtr)0x0) && (type == XML_TEXT_NODE)) && (ctxt->linenumbers != 0))
       && (ctxt->input != (xmlParserInputPtr)0x0)) {
      if ((uint)ctxt->input->line < 0xffff) {
        _maxLength->line = (unsigned_short)ctxt->input->line;
      }
      else {
        _maxLength->line = 0xffff;
        if ((ctxt->options & 0x400000U) != 0) {
          _maxLength->psvi = (void *)(long)ctxt->input->line;
        }
      }
    }
    return;
  }
  return;
}

Assistant:

static void
xmlSAX2Text(xmlParserCtxtPtr ctxt, const xmlChar *ch, int len,
            xmlElementType type)
{
    xmlNodePtr lastChild;

    if (ctxt == NULL) return;
    /*
     * Handle the data if any. If there is no child
     * add it as content, otherwise if the last child is text,
     * concatenate it, else create a new node of type text.
     */

    if (ctxt->node == NULL) {
        return;
    }
    lastChild = ctxt->node->last;

    /*
     * Here we needed an accelerator mechanism in case of very large
     * elements. Use an attribute in the structure !!!
     */
    if (lastChild == NULL) {
        if (type == XML_TEXT_NODE)
            lastChild = xmlSAX2TextNode(ctxt, ch, len);
        else
            lastChild = xmlNewCDataBlock(ctxt->myDoc, ch, len);
	if (lastChild != NULL) {
	    ctxt->node->children = lastChild;
	    ctxt->node->last = lastChild;
	    lastChild->parent = ctxt->node;
	    lastChild->doc = ctxt->node->doc;
	    ctxt->nodelen = len;
	    ctxt->nodemem = len + 1;
	} else {
	    xmlSAX2ErrMemory(ctxt);
	    return;
	}
    } else {
	int coalesceText = (lastChild != NULL) &&
	    (lastChild->type == type) &&
	    (((ctxt->html) && (type != XML_TEXT_NODE)) ||
             (lastChild->name == xmlStringText));
	if ((coalesceText) && (ctxt->nodemem != 0)) {
            int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                            XML_MAX_HUGE_LENGTH :
                            XML_MAX_TEXT_LENGTH;

	    /*
	     * The whole point of maintaining nodelen and nodemem,
	     * xmlTextConcat is too costly, i.e. compute length,
	     * reallocate a new buffer, move data, append ch. Here
	     * We try to minimize realloc() uses and avoid copying
	     * and recomputing length over and over.
	     */
	    if (lastChild->content == (xmlChar *)&(lastChild->properties)) {
		lastChild->content = xmlStrdup(lastChild->content);
		lastChild->properties = NULL;
	    } else if ((ctxt->nodemem == ctxt->nodelen + 1) &&
	               (xmlDictOwns(ctxt->dict, lastChild->content))) {
		lastChild->content = xmlStrdup(lastChild->content);
	    }
	    if (lastChild->content == NULL) {
		xmlSAX2ErrMemory(ctxt);
		return;
 	    }
            if ((len > maxLength) || (ctxt->nodelen > maxLength - len)) {
                xmlFatalErr(ctxt, XML_ERR_RESOURCE_LIMIT,
                            "Text node too long, try XML_PARSE_HUGE");
                xmlHaltParser(ctxt);
                return;
            }
	    if (ctxt->nodelen + len >= ctxt->nodemem) {
		xmlChar *newbuf;
		int size;

		size = ctxt->nodemem > INT_MAX - len ?
                       INT_MAX :
                       ctxt->nodemem + len;
		size = size > INT_MAX / 2 ? INT_MAX : size * 2;
                newbuf = (xmlChar *) xmlRealloc(lastChild->content,size);
		if (newbuf == NULL) {
		    xmlSAX2ErrMemory(ctxt);
		    return;
		}
		ctxt->nodemem = size;
		lastChild->content = newbuf;
	    }
	    memcpy(&lastChild->content[ctxt->nodelen], ch, len);
	    ctxt->nodelen += len;
	    lastChild->content[ctxt->nodelen] = 0;
	} else if (coalesceText) {
	    if (xmlTextConcat(lastChild, ch, len)) {
		xmlSAX2ErrMemory(ctxt);
	    }
	    if (ctxt->node->children != NULL) {
		ctxt->nodelen = xmlStrlen(lastChild->content);
		ctxt->nodemem = ctxt->nodelen + 1;
	    }
	} else {
	    /* Mixed content, first time */
            if (type == XML_TEXT_NODE) {
                lastChild = xmlSAX2TextNode(ctxt, ch, len);
                if (lastChild != NULL)
                    lastChild->doc = ctxt->myDoc;
            } else
                lastChild = xmlNewCDataBlock(ctxt->myDoc, ch, len);
	    if (lastChild == NULL) {
                xmlSAX2ErrMemory(ctxt);
            } else {
		xmlSAX2AppendChild(ctxt, lastChild);
		if (ctxt->node->children != NULL) {
		    ctxt->nodelen = len;
		    ctxt->nodemem = len + 1;
		}
	    }
	}
    }

    if ((lastChild != NULL) &&
        (type == XML_TEXT_NODE) &&
        (ctxt->linenumbers) &&
        (ctxt->input != NULL)) {
        if ((unsigned) ctxt->input->line < (unsigned) USHRT_MAX)
            lastChild->line = ctxt->input->line;
        else {
            lastChild->line = USHRT_MAX;
            if (ctxt->options & XML_PARSE_BIG_LINES)
                lastChild->psvi = XML_INT_TO_PTR(ctxt->input->line);
        }
    }
}